

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O3

QPlatformScreen * __thiscall
QKmsDevice::createScreenForConnector
          (QKmsDevice *this,drmModeResPtr resources,drmModeConnectorPtr connector,ScreenInfo *vinfo)

{
  QList<_drmModeModeInfo> *this_00;
  QList<QKmsPlane> *this_01;
  QList<_drmModeModeInfo> *this_02;
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  drmModeModeInfoPtr p_Var4;
  Data *pDVar5;
  Data *pDVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  QSize QVar11;
  uint uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  QKmsPlane *pQVar22;
  bool bVar23;
  bool bVar24;
  char cVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  const_iterator cVar31;
  long lVar32;
  long lVar33;
  pointer p_Var34;
  iterator iVar35;
  iterator iVar36;
  int *piVar37;
  long lVar38;
  QKmsPlane *pQVar39;
  QPlatformScreen *pQVar40;
  QString *pQVar41;
  QKmsPlane *plane;
  QTextStream *pQVar42;
  ulong uVar43;
  uint uVar44;
  uint32_t uVar45;
  _Base_ptr p_Var46;
  char *pcVar47;
  storage_type *psVar48;
  undefined4 *puVar49;
  QArrayData *pQVar50;
  char16_t *pcVar51;
  anon_union_24_3_e3d07ef4_for_data *paVar52;
  QByteArray *pQVar53;
  _func_int **pp_Var54;
  uint uVar55;
  ulong uVar56;
  uint uVar57;
  ulong uVar58;
  _drmModeModeInfo *__s2;
  long in_FS_OFFSET;
  byte bVar59;
  undefined1 auVar60 [16];
  QByteArrayView QVar61;
  QByteArrayView QVar62;
  QByteArrayView QVar63;
  QByteArrayView QVar64;
  QByteArrayView QVar65;
  QByteArrayView QVar66;
  QByteArrayView QVar67;
  QByteArrayView QVar68;
  QByteArrayView QVar69;
  QByteArrayView QVar70;
  QByteArrayView QVar71;
  QByteArrayView QVar72;
  QByteArrayView QVar73;
  QByteArrayView QVar74;
  QByteArrayView QVar75;
  QByteArrayView QVar76;
  QByteArrayView QVar77;
  QByteArrayView QVar78;
  QByteArrayView QVar79;
  QByteArrayView QVar80;
  QByteArrayView QVar81;
  QByteArrayView QVar82;
  QByteArrayView QVar83;
  QByteArrayView QVar84;
  QByteArrayView QVar85;
  QByteArrayView QVar86;
  QStringView QVar87;
  QStringView QVar88;
  QList<QKmsPlane> *__range5;
  uint local_3b8;
  QArrayDataPointer<QString> local_368;
  bool ok;
  QSize local_348;
  undefined1 local_340 [8];
  QString local_338;
  QSize local_318;
  undefined1 local_310 [16];
  undefined1 auStack_300 [80];
  _drmModeModeInfo *p_Stack_2b0;
  QArrayData *local_2a8;
  QByteArray local_298;
  QVariantMap userConnectorConfig;
  undefined1 local_270 [12];
  int configurationRefresh;
  undefined8 local_260;
  QByteArray connectorName;
  undefined1 local_238 [24];
  Data *local_220;
  undefined1 local_218 [32];
  anon_union_24_3_e3d07ef4_for_data local_1f8;
  char *local_1e0;
  anon_union_24_3_e3d07ef4_for_data local_1d8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined4 local_198;
  anon_union_24_3_e3d07ef4_for_data local_188;
  undefined8 uStack_170;
  ulong local_168;
  Data *local_160;
  QKmsPlane *pQStack_158;
  undefined8 local_150;
  ulong uStack_148;
  drmModeCrtcPtr local_140;
  undefined1 auStack_138 [24];
  undefined8 local_120;
  drmModePropertyPtr p_Stack_118;
  drmModePropertyBlobPtr local_110;
  uint uStack_108;
  uint32_t uStack_104;
  uint uStack_100;
  uint uStack_fc;
  char cStack_f8;
  undefined7 uStack_f7;
  QString QStack_f0;
  undefined1 auStack_d8 [24];
  QKmsPlane *local_c0;
  QSize QStack_b8;
  undefined8 local_b0;
  QSize QStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  drmModeModeInfo configurationModeline;
  undefined4 extraout_var;
  
  bVar59 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  connectorName.d.size = -0x5555555555555556;
  connectorName.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  connectorName.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&connectorName,"UNKNOWN",-1);
  if ((ulong)connector->connector_type < 0x11) {
    QByteArray::operator=
              (&connectorName,
               _ZL20connector_type_names_rel +
               *(int *)(_ZL20connector_type_names_rel + (ulong)connector->connector_type * 4));
  }
  QByteArray::number((uint)&local_188,connector->connector_type_id);
  QByteArray::append(&connectorName);
  piVar37 = (int *)CONCAT44(local_188._4_4_,local_188._0_4_);
  if (piVar37 != (int *)0x0) {
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_188._4_4_,local_188._0_4_),1,0x10);
    }
  }
  uVar26 = crtcForConnector(this,resources,connector);
  if ((int)uVar26 < 0) {
    local_188._0_4_ = 2;
    local_188._4_4_ = 0;
    local_188._8_4_ = 0;
    local_188._12_4_ = 0;
    local_188._16_4_ = 0;
    local_188._20_4_ = 0;
    uStack_170 = "default";
    QMessageLogger::warning();
    uVar13 = local_1d8.shared;
    QVar70.m_data = (storage_type *)0x29;
    QVar70.m_size = (qsizetype)&configurationModeline;
    QString::fromUtf8(QVar70);
    QTextStream::operator<<((QTextStream *)uVar13,(QString *)&configurationModeline);
    if (configurationModeline._0_8_ != 0) {
      LOCK();
      *(int *)configurationModeline._0_8_ = *(int *)configurationModeline._0_8_ + -1;
      UNLOCK();
      if (*(int *)configurationModeline._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)configurationModeline._0_8_,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_1d8.shared + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_1d8.shared,' ');
    }
    pcVar47 = connectorName.d.ptr;
    if (connectorName.d.ptr == (char *)0x0) {
      pcVar47 = (char *)&QByteArray::_empty;
    }
    QDebug::putByteArray((char *)local_1d8.data,(ulong)pcVar47,(Latin1Content)connectorName.d.size);
    if ((char)(((QArrayData *)(local_1d8.shared + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_1d8.shared,' ');
    }
    QDebug::~QDebug((QDebug *)&local_1d8.shared);
    pQVar40 = (QPlatformScreen *)0x0;
    goto LAB_0011685f;
  }
  local_260 = -1;
  configurationRefresh = 0;
  configurationModeline.name[0xc] = -0x56;
  configurationModeline.name[0xd] = -0x56;
  configurationModeline.name[0xe] = -0x56;
  configurationModeline.name[0xf] = -0x56;
  configurationModeline.name[0x10] = -0x56;
  configurationModeline.name[0x11] = -0x56;
  configurationModeline.name[0x12] = -0x56;
  configurationModeline.name[0x13] = -0x56;
  configurationModeline.name[0x14] = -0x56;
  configurationModeline.name[0x15] = -0x56;
  configurationModeline.name[0x16] = -0x56;
  configurationModeline.name[0x17] = -0x56;
  configurationModeline.name[0x18] = -0x56;
  configurationModeline.name[0x19] = -0x56;
  configurationModeline.name[0x1a] = -0x56;
  configurationModeline.name[0x1b] = -0x56;
  configurationModeline.type = 0xaaaaaaaa;
  configurationModeline.name[0] = -0x56;
  configurationModeline.name[1] = -0x56;
  configurationModeline.name[2] = -0x56;
  configurationModeline.name[3] = -0x56;
  configurationModeline.name[4] = -0x56;
  configurationModeline.name[5] = -0x56;
  configurationModeline.name[6] = -0x56;
  configurationModeline.name[7] = -0x56;
  configurationModeline.name[8] = -0x56;
  configurationModeline.name[9] = -0x56;
  configurationModeline.name[10] = -0x56;
  configurationModeline.name[0xb] = -0x56;
  configurationModeline.vsync_start = 0xaaaa;
  configurationModeline.vsync_end = 0xaaaa;
  configurationModeline.vtotal = 0xaaaa;
  configurationModeline.vscan = 0xaaaa;
  configurationModeline.vrefresh = 0xaaaaaaaa;
  configurationModeline.flags = 0xaaaaaaaa;
  configurationModeline.clock = 0xaaaaaaaa;
  configurationModeline.hdisplay = 0xaaaa;
  configurationModeline.hsync_start = 0xaaaa;
  configurationModeline.hsync_end = 0xaaaa;
  configurationModeline.htotal = 0xaaaa;
  configurationModeline.hskew = 0xaaaa;
  configurationModeline.vdisplay = 0xaaaa;
  configurationModeline.name[0x1c] = -0x56;
  configurationModeline.name[0x1d] = -0x56;
  configurationModeline.name[0x1e] = -0x56;
  configurationModeline.name[0x1f] = -0x56;
  local_270._0_8_ = (this->m_screenConfig->m_outputSettings).d.d.ptr;
  if ((QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
       *)local_270._0_8_ !=
      (QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
       *)0x0) {
    LOCK();
    (((QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
       *)local_270._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
                        *)local_270._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  userConnectorConfig.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
          )0xaaaaaaaaaaaaaaaa;
  QVar61.m_data = (storage_type *)connectorName.d.size;
  QVar61.m_size = (qsizetype)&local_188;
  QString::fromUtf8(QVar61);
  local_1d8.shared = (PrivateShared *)0x0;
  QMap<QString,_QMap<QString,_QVariant>_>::value
            ((QMap<QString,_QMap<QString,_QVariant>_> *)&userConnectorConfig,(QString *)local_270,
             (QMap<QString,_QVariant> *)&local_188.shared);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
              *)&local_1d8.shared);
  piVar37 = (int *)CONCAT44(local_188._4_4_,local_188._0_4_);
  if (piVar37 != (int *)0x0) {
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_188._4_4_,local_188._0_4_),2,0x10);
    }
  }
  local_298.d.size = -0x5555555555555556;
  local_298.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_298.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_218._0_8_ = (QArrayData *)0x0;
  local_218._8_8_ = L"mode";
  local_218._16_8_ = 4;
  local_238._0_8_ = (QArrayData *)0x0;
  local_238._8_8_ = L"preferred";
  local_238._16_8_ = 9;
  QVariant::QVariant((QVariant *)&local_1d8,(QString *)local_238);
  QMap<QString,_QVariant>::value
            ((QVariant *)&local_188,&userConnectorConfig,(QString *)local_218,(QVariant *)&local_1d8
            );
  QVariant::toByteArray();
  QByteArray::toLower_helper(&local_298);
  piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
  if (piVar37 != (int *)0x0) {
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),1,0x10);
    }
  }
  QVariant::~QVariant((QVariant *)&local_188);
  QVariant::~QVariant((QVariant *)&local_1d8);
  if ((QArrayData *)local_238._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_238._0_8_ = *(int *)local_238._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_238._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_218._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
    }
  }
  local_188._0_4_ = 0x127b14;
  local_188._4_4_ = 0;
  bVar23 = operator==(&local_298,(char **)&local_188.shared);
  if (bVar23) {
    bVar7 = false;
LAB_0011589f:
    bVar24 = false;
LAB_001158a2:
    bVar9 = false;
LAB_001158a4:
    bVar10 = false;
LAB_001158a6:
    bVar8 = false;
  }
  else {
    local_188._0_4_ = 0x127b18;
    local_188._4_4_ = 0;
    bVar24 = operator==(&local_298,(char **)&local_188.shared);
    if (bVar24) {
LAB_0011589c:
      bVar7 = true;
      goto LAB_0011589f;
    }
    local_188._0_4_ = 0x127b22;
    local_188._4_4_ = 0;
    bVar24 = operator==(&local_298,(char **)&local_188.shared);
    if (bVar24) {
      bVar10 = true;
      bVar7 = false;
      bVar24 = false;
      bVar9 = false;
      goto LAB_001158a6;
    }
    local_188._0_4_ = 0x127b2a;
    local_188._4_4_ = 0;
    bVar24 = operator==(&local_298,(char **)&local_188.shared);
    if (bVar24) {
      bVar24 = true;
      bVar7 = false;
      goto LAB_001158a2;
    }
    pQVar53 = (QByteArray *)local_298.d.ptr;
    if ((QByteArray *)local_298.d.ptr == (QByteArray *)0x0) {
      pQVar53 = (QByteArray *)&QByteArray::_empty;
    }
    bVar7 = false;
    iVar27 = __isoc99_sscanf(pQVar53,"%dx%d@%d",&local_260,(long)&local_260 + 4,
                             &configurationRefresh);
    bVar8 = true;
    if (iVar27 != 3) {
      pQVar53 = (QByteArray *)local_298.d.ptr;
      if ((QByteArray *)local_298.d.ptr == (QByteArray *)0x0) {
        pQVar53 = (QByteArray *)&QByteArray::_empty;
      }
      bVar7 = false;
      iVar27 = __isoc99_sscanf(pQVar53,"%dx%d",&local_260,(long)&local_260 + 4);
      bVar24 = false;
      bVar9 = false;
      bVar10 = false;
      if (iVar27 == 2) goto LAB_001158ad;
      bVar24 = parseModeline((QByteArray *)local_298.d.ptr,&configurationModeline);
      if (!bVar24) {
        createScreenForConnector();
        goto LAB_0011589c;
      }
      bVar9 = true;
      bVar7 = false;
      bVar24 = false;
      goto LAB_001158a4;
    }
    bVar24 = false;
    bVar9 = false;
    bVar10 = false;
    bVar8 = true;
  }
LAB_001158ad:
  memset(&local_188,0,0xa8);
  local_150 = 0xbff0000000000000;
  uStack_148 = 0xbff0000000000000;
  local_140 = (drmModeCrtcPtr)0xffffffffffffffff;
  auStack_138._8_8_ = (_drmModeModeInfo *)0x0;
  auStack_138._16_8_ = (QArrayData *)0x0;
  local_120 = 0;
  p_Stack_118 = (drmModePropertyPtr)0x0;
  local_110 = (drmModePropertyBlobPtr)CONCAT44(local_110._4_4_,1);
  QStack_f0.d.d._0_4_ = (uint)QStack_f0.d.d & 0xffffff00;
  uStack_108 = 0;
  uStack_104 = 0;
  uStack_100 = 0;
  uStack_fc = 0;
  cStack_f8 = '\0';
  QStack_f0.d.d._4_4_ = 0x34325258;
  QStack_f0.d.size = 0;
  auStack_d8._0_8_ = (Data *)0x0;
  auStack_d8._8_8_ = (QKmsPlane *)0x0;
  auStack_d8._16_8_ = (Data *)0x0;
  local_c0 = (QKmsPlane *)0x0;
  QStack_b8.wd.m_i = 0;
  QStack_b8.ht.m_i = 0;
  local_b0 = (QKmsPlane *)0x0;
  QStack_a8.wd.m_i = -1;
  QStack_a8.ht.m_i = -1;
  local_a0 = 0;
  uStack_98 = 0;
  *(undefined8 *)((long)&(vinfo->virtualPos).xp.m_i + 1) = 0;
  vinfo->virtualIndex = 0;
  (vinfo->virtualPos).xp = 0;
  pDVar5 = (vinfo->output).name.d.d;
  uStack_170 = (char *)(vinfo->output).name.d.ptr;
  (vinfo->output).name.d.d = (Data *)0x0;
  (vinfo->output).name.d.ptr = (char16_t *)0x0;
  local_188._16_4_ = SUB84(pDVar5,0);
  local_188._20_4_ = (undefined4)((ulong)pDVar5 >> 0x20);
  local_168 = (vinfo->output).name.d.size;
  (vinfo->output).name.d.size = 0;
  (vinfo->output).saved_crtc = (drmModeCrtcPtr)0x0;
  (vinfo->output).preferred_mode = -1;
  (vinfo->output).mode = -1;
  *(undefined8 *)&(vinfo->output).mode_set = auStack_138._0_8_;
  (vinfo->output).physical_size.wd = -1.0;
  (vinfo->output).physical_size.ht = -1.0;
  *(Data **)&(vinfo->output).connector_id = local_160;
  *(QKmsPlane **)&(vinfo->output).crtc_id = pQStack_158;
  this_00 = &(vinfo->output).modes;
  QArrayDataPointer<_drmModeModeInfo>::operator=
            (&this_00->d,(QArrayDataPointer<_drmModeModeInfo> *)(auStack_138 + 0x10));
  QVar11 = QStack_b8;
  pQVar22 = local_c0;
  uVar13 = auStack_d8._16_8_;
  *(drmModePropertyBlobPtr *)&(vinfo->output).subpixel = local_110;
  (vinfo->output).dpms_prop = (drmModePropertyPtr)CONCAT44(uStack_104,uStack_108);
  (vinfo->output).edid_blob = (drmModePropertyBlobPtr)CONCAT44(uStack_fc,uStack_100);
  (vinfo->output).wants_forced_plane = (bool)cStack_f8;
  *(int3 *)&(vinfo->output).field_0x81 = (int3)uStack_f7;
  (vinfo->output).forced_plane_id = (int)((uint7)uStack_f7 >> 0x18);
  *(ulong *)&(vinfo->output).field_0x81 = CONCAT17(QStack_f0.d.d._0_1_,uStack_f7);
  *(ulong *)&(vinfo->output).field_0x89 =
       CONCAT17(QStack_f0.d.ptr._0_1_,CONCAT43(QStack_f0.d.d._4_4_,QStack_f0.d.d._1_3_));
  pQVar50 = &((vinfo->output).clone_source.d.d)->super_QArrayData;
  pDVar6 = (Data *)(vinfo->output).clone_source.d.ptr;
  (vinfo->output).clone_source.d.d = (Data *)QStack_f0.d.size;
  (vinfo->output).clone_source.d.ptr = (char16_t *)auStack_d8._0_8_;
  pQVar39 = (QKmsPlane *)(vinfo->output).clone_source.d.size;
  (vinfo->output).clone_source.d.size = auStack_d8._8_8_;
  QStack_b8.wd.m_i = 0;
  QStack_b8.ht.m_i = 0;
  auStack_d8._16_8_ = 0;
  local_c0 = (QKmsPlane *)0x0;
  local_1d8.shared = (PrivateShared *)(vinfo->output).available_planes.d.d;
  local_1d8._8_8_ = (vinfo->output).available_planes.d.ptr;
  (vinfo->output).available_planes.d.d = (Data *)uVar13;
  (vinfo->output).available_planes.d.ptr = pQVar22;
  local_1d8._16_8_ = (vinfo->output).available_planes.d.size;
  (vinfo->output).available_planes.d.size = (qsizetype)QVar11;
  QStack_f0.d.size = (qsizetype)pQVar50;
  auStack_d8._0_8_ = pDVar6;
  auStack_d8._8_8_ = pQVar39;
  QArrayDataPointer<QKmsPlane>::~QArrayDataPointer((QArrayDataPointer<QKmsPlane> *)&local_1d8);
  (vinfo->output).crtcIdPropertyId = (undefined4)local_a0;
  (vinfo->output).modeIdPropertyId = local_a0._4_4_;
  (vinfo->output).activePropertyId = (undefined4)uStack_98;
  (vinfo->output).mode_blob_id = uStack_98._4_4_;
  (vinfo->output).eglfs_plane = local_b0;
  (vinfo->output).size = QStack_a8;
  QArrayDataPointer<QKmsPlane>::~QArrayDataPointer
            ((QArrayDataPointer<QKmsPlane> *)(auStack_d8 + 0x10));
  if ((QArrayData *)QStack_f0.d.size != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)QStack_f0.d.size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)QStack_f0.d.size)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)QStack_f0.d.size)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)QStack_f0.d.size,2,0x10);
    }
  }
  if ((QArrayData *)auStack_138._16_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_138._16_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_138._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_138._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_138._16_8_,0x44,0x10);
    }
  }
  piVar37 = (int *)CONCAT44(local_188._20_4_,local_188._16_4_);
  if (piVar37 != (int *)0x0) {
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_188._20_4_,local_188._16_4_),2,0x10);
    }
  }
  local_1f8._0_4_ = 0;
  local_1f8._4_4_ = 0;
  local_1f8._8_4_ = 0x128740;
  local_1f8._12_4_ = 0;
  local_1f8._16_4_ = 0xc;
  local_1f8._20_4_ = 0;
  QVariant::QVariant((QVariant *)&local_1d8,0x7fffffff);
  QMap<QString,_QVariant>::value
            ((QVariant *)&local_188,&userConnectorConfig,(QString *)&local_1f8,
             (QVariant *)&local_1d8);
  iVar27 = QVariant::toInt((bool *)local_188.data);
  vinfo->virtualIndex = iVar27;
  QVariant::~QVariant((QVariant *)&local_188);
  QVariant::~QVariant((QVariant *)&local_1d8);
  piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
  if (piVar37 != (int *)0x0) {
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
    }
  }
  local_188._0_4_ = 0;
  local_188._4_4_ = 0;
  local_188._8_4_ = 0x12875a;
  local_188._12_4_ = 0;
  local_188._16_4_ = 10;
  local_188._20_4_ = 0;
  if (userConnectorConfig.d.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
       )0x0) {
    cVar31 = std::
             _Rb_tree<QString,_std::pair<const_QString,_QVariant>,_std::_Select1st<std::pair<const_QString,_QVariant>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
             ::find((_Rb_tree<QString,_std::pair<const_QString,_QVariant>,_std::_Select1st<std::pair<const_QString,_QVariant>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
                     *)((long)userConnectorConfig.d.d.ptr + 8),(key_type *)&local_188);
    p_Var46 = (_Base_ptr)((long)userConnectorConfig.d.d.ptr + 0x10);
    piVar37 = (int *)CONCAT44(local_188._4_4_,local_188._0_4_);
    if (piVar37 != (int *)0x0) {
      LOCK();
      *piVar37 = *piVar37 + -1;
      UNLOCK();
      if (*piVar37 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_188._4_4_,local_188._0_4_),2,0x10);
      }
    }
    if (cVar31._M_node != p_Var46) {
      local_1f8._16_4_ = 0xaaaaaaaa;
      local_1f8._20_4_ = 0xaaaaaaaa;
      local_1f8._0_4_ = 0xaaaaaaaa;
      local_1f8._4_4_ = 0xaaaaaaaa;
      local_1f8._8_4_ = 0xaaaaaaaa;
      local_1f8._12_4_ = 0xaaaaaaaa;
      local_218._0_8_ = (QArrayData *)0x0;
      local_218._8_8_ = L"virtualPos";
      local_218._16_8_ = 10;
      local_1d8._16_8_ = 0;
      local_1d8.shared = (PrivateShared *)0x0;
      local_1d8._8_8_ = 0;
      uStack_1c0 = 2;
      QMap<QString,_QVariant>::value
                ((QVariant *)&local_188,&userConnectorConfig,(QString *)local_218,
                 (QVariant *)&local_1d8);
      QVariant::toByteArray();
      QVariant::~QVariant((QVariant *)&local_188);
      QVariant::~QVariant((QVariant *)&local_1d8);
      if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_218._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
        }
      }
      local_188._16_4_ = 0xaaaaaaaa;
      local_188._20_4_ = 0xaaaaaaaa;
      local_188._0_4_ = 0xaaaaaaaa;
      local_188._4_4_ = 0xaaaaaaaa;
      local_188._8_4_ = 0xaaaaaaaa;
      local_188._12_4_ = 0xaaaaaaaa;
      QByteArray::split((char)&local_188);
      if (CONCAT44(local_188._20_4_,local_188._16_4_) == 2) {
        QByteArray::trimmed_helper((QByteArray *)&local_1d8);
        uVar28 = QByteArray::toInt((bool *)local_1d8.data,0);
        QByteArray::trimmed_helper((QByteArray *)local_218);
        lVar32 = QByteArray::toInt((bool *)local_218,0);
        vinfo->virtualPos = (QPoint)((ulong)uVar28 | lVar32 << 0x20);
        if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_218._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_218._0_8_,1,0x10);
          }
        }
        if ((QArrayData *)local_1d8.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_1d8.shared = *(int *)local_1d8.shared + -1;
          UNLOCK();
          if (*(int *)local_1d8.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_1d8.shared,1,0x10);
          }
        }
      }
      QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)&local_188)
      ;
      piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
      if (piVar37 != (int *)0x0) {
        LOCK();
        *piVar37 = *piVar37 + -1;
        UNLOCK();
        if (*piVar37 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),1,0x10);
        }
      }
    }
  }
  local_1f8._0_4_ = 0;
  local_1f8._4_4_ = 0;
  local_1f8._8_4_ = 0x128770;
  local_1f8._12_4_ = 0;
  local_1f8._16_4_ = 7;
  local_1f8._20_4_ = 0;
  local_1d8._16_8_ = 0;
  local_1d8.shared = (PrivateShared *)0x0;
  local_1d8._8_8_ = 0;
  uStack_1c0 = 2;
  QMap<QString,_QVariant>::value
            ((QVariant *)&local_188,&userConnectorConfig,(QString *)&local_1f8,
             (QVariant *)&local_1d8);
  cVar25 = QVariant::toBool();
  QVariant::~QVariant((QVariant *)&local_188);
  QVariant::~QVariant((QVariant *)&local_1d8);
  piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
  if (piVar37 != (int *)0x0) {
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
    }
  }
  if (cVar25 != '\0') {
    vinfo->isPrimary = true;
  }
  uVar28 = resources->crtcs[uVar26];
  if (bVar23) {
    qLcKmsDebug();
    if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_188._0_4_ = 2;
      local_188._4_4_ = 0;
      local_188._8_4_ = 0;
      local_188._12_4_ = 0;
      local_188._16_4_ = 0;
      local_188._20_4_ = 0;
      uStack_170 = qLcKmsDebug::category.name;
      QMessageLogger::debug();
      pQVar42 = (QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
      QVar62.m_data = (storage_type *)0x12;
      QVar62.m_size = (qsizetype)&local_1d8;
      QString::fromUtf8(QVar62);
      QTextStream::operator<<(pQVar42,(QString *)&local_1d8);
      if ((QArrayData *)local_1d8.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_1d8.shared = *(int *)local_1d8.shared + -1;
        UNLOCK();
        if (*(int *)local_1d8.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_1d8.shared,2,0x10);
        }
      }
      if (((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_))[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),' ');
      }
      pcVar47 = connectorName.d.ptr;
      if (connectorName.d.ptr == (char *)0x0) {
        pcVar47 = (char *)&QByteArray::_empty;
      }
      QDebug::putByteArray
                ((char *)local_1f8.data,(ulong)pcVar47,(Latin1Content)connectorName.d.size);
      if (((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_))[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),' ');
      }
      QDebug::~QDebug((QDebug *)&local_1f8.shared);
    }
    pQVar40 = (QPlatformScreen *)0x0;
    drmModeSetCrtc(this->m_dri_fd,uVar28,0,0,0,0,0,0);
  }
  else {
    if ((bVar7) && (connector->connection == DRM_MODE_DISCONNECTED)) {
      qLcKmsDebug();
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_188._0_4_ = 2;
        local_188._4_4_ = 0;
        local_188._8_4_ = 0;
        local_188._12_4_ = 0;
        local_188._16_4_ = 0;
        local_188._20_4_ = 0;
        uStack_170 = qLcKmsDebug::category.name;
        QMessageLogger::debug();
        pQVar42 = (QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
        psVar48 = (storage_type *)0x1c;
LAB_00116095:
        QVar63.m_data = psVar48;
        QVar63.m_size = (qsizetype)&local_1d8;
        QString::fromUtf8(QVar63);
        QTextStream::operator<<(pQVar42,(QString *)&local_1d8);
        if ((QArrayData *)local_1d8.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_1d8.shared = *(int *)local_1d8.shared + -1;
          UNLOCK();
          if (*(int *)local_1d8.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_1d8.shared,2,0x10);
          }
        }
        if (((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_))[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),' ');
        }
        pcVar47 = connectorName.d.ptr;
        if (connectorName.d.ptr == (char *)0x0) {
          pcVar47 = (char *)&QByteArray::_empty;
        }
        QDebug::putByteArray
                  ((char *)local_1f8.data,(ulong)pcVar47,(Latin1Content)connectorName.d.size);
        if (((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_))[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),' ');
        }
        QDebug::~QDebug((QDebug *)&local_1f8.shared);
      }
    }
    else {
      if (!bVar24) {
        local_1a8 = 0;
        uStack_1a0 = 0;
        local_1b8 = 0;
        uStack_1b0 = 0;
        local_1d8._16_8_ = 0;
        uStack_1c0 = 0;
        local_1d8.shared = (PrivateShared *)0x0;
        local_1d8._8_8_ = 0;
        local_198 = 0;
        lVar32 = drmModeGetEncoder(this->m_dri_fd,connector->encoder_id);
        if (lVar32 != 0) {
          lVar33 = drmModeGetCrtc(this->m_dri_fd,*(undefined4 *)(lVar32 + 8));
          drmModeFreeEncoder(lVar32);
          if (lVar33 == 0) goto LAB_0011681a;
          if (*(int *)(lVar33 + 0x18) != 0) {
            puVar49 = (undefined4 *)(lVar33 + 0x1c);
            paVar52 = &local_1d8;
            for (lVar32 = 0x11; lVar32 != 0; lVar32 = lVar32 + -1) {
              *(undefined4 *)paVar52 = *puVar49;
              puVar49 = puVar49 + (ulong)bVar59 * -2 + 1;
              paVar52 = (anon_union_24_3_e3d07ef4_for_data *)
                        ((long)paVar52 + (ulong)bVar59 * -8 + 4);
            }
          }
          drmModeFreeCrtc(lVar33);
        }
        auStack_300._72_8_ = (QArrayData *)0x0;
        p_Stack_2b0 = (_drmModeModeInfo *)0x0;
        local_2a8 = (QArrayData *)0x0;
        QList<_drmModeModeInfo>::reserve
                  ((QList<_drmModeModeInfo> *)(auStack_300 + 0x48),(long)connector->count_modes);
        qLcKmsDebug();
        if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
        {
          local_188._0_4_ = 2;
          local_188._4_4_ = 0;
          local_188._8_4_ = 0;
          local_188._12_4_ = 0;
          local_188._16_4_ = 0;
          local_188._20_4_ = 0;
          uStack_170 = qLcKmsDebug::category.name;
          QMessageLogger::debug();
          pcVar47 = connectorName.d.ptr;
          if (connectorName.d.ptr == (char *)0x0) {
            pcVar47 = (char *)&QByteArray::_empty;
          }
          QDebug::putByteArray(local_218,(ulong)pcVar47,(Latin1Content)connectorName.d.size);
          if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
          }
          uVar13 = local_218._0_8_;
          QVar64.m_data = (storage_type *)0xb;
          QVar64.m_size = (qsizetype)&local_1f8;
          QString::fromUtf8(QVar64);
          QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
          piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
          if (piVar37 != (int *)0x0) {
            LOCK();
            *piVar37 = *piVar37 + -1;
            UNLOCK();
            if (*piVar37 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10)
              ;
            }
          }
          if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
          }
          QTextStream::operator<<((QTextStream *)local_218._0_8_,connector->count_modes);
          if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
          }
          uVar13 = local_218._0_8_;
          QVar65.m_data = (storage_type *)0xb;
          QVar65.m_size = (qsizetype)&local_1f8;
          QString::fromUtf8(QVar65);
          QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
          piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
          if (piVar37 != (int *)0x0) {
            LOCK();
            *piVar37 = *piVar37 + -1;
            UNLOCK();
            if (*piVar37 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10)
              ;
            }
          }
          if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
          }
          QTextStream::operator<<((QTextStream *)local_218._0_8_,uVar26);
          if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
          }
          uVar13 = local_218._0_8_;
          QVar66.m_data = (storage_type *)0x8;
          QVar66.m_size = (qsizetype)&local_1f8;
          QString::fromUtf8(QVar66);
          QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
          piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
          if (piVar37 != (int *)0x0) {
            LOCK();
            *piVar37 = *piVar37 + -1;
            UNLOCK();
            if (*piVar37 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10)
              ;
            }
          }
          if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
          }
          QTextStream::operator<<((QTextStream *)local_218._0_8_,uVar28);
          if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
          }
          QDebug::~QDebug((QDebug *)local_218);
        }
        if (0 < connector->count_modes) {
          lVar33 = 0;
          lVar32 = 0;
          do {
            p_Var4 = connector->modes;
            qLcKmsDebug();
            if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                != 0) {
              local_188._0_4_ = 2;
              local_188._4_4_ = 0;
              local_188._8_4_ = 0;
              local_188._12_4_ = 0;
              local_188._16_4_ = 0;
              local_188._20_4_ = 0;
              uStack_170 = qLcKmsDebug::category.name;
              QMessageLogger::debug();
              uVar13 = local_218._0_8_;
              QVar67.m_data = (storage_type *)0x4;
              QVar67.m_size = (qsizetype)&local_1f8;
              QString::fromUtf8(QVar67);
              QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
              piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
              if (piVar37 != (int *)0x0) {
                LOCK();
                *piVar37 = *piVar37 + -1;
                UNLOCK();
                if (*piVar37 == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
                }
              }
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              QTextStream::operator<<((QTextStream *)local_218._0_8_,(int)lVar32);
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              QTextStream::operator<<
                        ((QTextStream *)local_218._0_8_,*(ushort *)(p_Var4->name + lVar33 + -0x20));
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              uVar13 = local_218._0_8_;
              QVar68.m_data = (storage_type *)0x1;
              QVar68.m_size = (qsizetype)&local_1f8;
              QString::fromUtf8(QVar68);
              QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
              piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
              if (piVar37 != (int *)0x0) {
                LOCK();
                *piVar37 = *piVar37 + -1;
                UNLOCK();
                if (*piVar37 == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
                }
              }
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              QTextStream::operator<<
                        ((QTextStream *)local_218._0_8_,*(ushort *)(p_Var4->name + lVar33 + -0x16));
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              QTextStream::operator<<((QTextStream *)local_218._0_8_,'@');
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              QTextStream::operator<<
                        ((QTextStream *)local_218._0_8_,*(uint *)(p_Var4->name + lVar33 + -0xc));
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              uVar13 = local_218._0_8_;
              QVar69.m_data = (storage_type *)0x2;
              QVar69.m_size = (qsizetype)&local_1f8;
              QString::fromUtf8(QVar69);
              QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
              piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
              if (piVar37 != (int *)0x0) {
                LOCK();
                *piVar37 = *piVar37 + -1;
                UNLOCK();
                if (*piVar37 == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
                }
              }
              if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
              }
              QDebug::~QDebug((QDebug *)local_218);
            }
            QtPrivate::QPodArrayOps<_drmModeModeInfo>::emplace<_drmModeModeInfo_const&>
                      ((QPodArrayOps<_drmModeModeInfo> *)(auStack_300 + 0x48),(qsizetype)local_2a8,
                       (_drmModeModeInfo *)(connector->modes->name + lVar33 + -0x24));
            QList<_drmModeModeInfo>::end((QList<_drmModeModeInfo> *)(auStack_300 + 0x48));
            lVar32 = lVar32 + 1;
            lVar33 = lVar33 + 0x44;
          } while (lVar32 < connector->count_modes);
        }
        iVar27 = configurationRefresh;
        pQVar50 = local_2a8;
        uVar29 = (int)local_2a8 - 1;
        if ((int)uVar29 < 0) {
          uVar44 = 0xffffffff;
          local_3b8 = 0xffffffff;
          uVar55 = 0xffffffff;
          uVar57 = 0xffffffff;
        }
        else {
          uVar44 = (uint)local_260;
          uVar12 = local_260._4_4_;
          __s2 = p_Stack_2b0 + uVar29;
          uVar58 = 0xffffffff;
          uVar56 = 0xffffffff;
          local_3b8 = 0xffffffff;
          uVar43 = (ulong)uVar29;
          do {
            if (((bVar8) && (uVar44 == __s2->hdisplay)) && (uVar12 == __s2->vdisplay)) {
              if (__s2->vrefresh == iVar27) {
                local_3b8 = (uint)uVar43;
              }
              if (iVar27 == 0) {
                local_3b8 = (uint)uVar43;
              }
            }
            iVar30 = bcmp(&local_1d8,__s2,0x44);
            if (iVar30 == 0) {
              uVar56 = uVar43 & 0xffffffff;
            }
            uVar55 = (uint)uVar56;
            if ((__s2->type & 8) != 0) {
              uVar58 = uVar43 & 0xffffffff;
            }
            uVar57 = (uint)uVar58;
            __s2 = __s2 + -1;
            bVar23 = 0 < (long)uVar43;
            uVar43 = uVar43 - 1;
          } while (bVar23);
          uVar44 = 0;
        }
        if (bVar9) {
          QtPrivate::QPodArrayOps<_drmModeModeInfo>::emplace<_drmModeModeInfo_const&>
                    ((QPodArrayOps<_drmModeModeInfo> *)(auStack_300 + 0x48),(qsizetype)pQVar50,
                     &configurationModeline);
          QList<_drmModeModeInfo>::end((QList<_drmModeModeInfo> *)(auStack_300 + 0x48));
          local_3b8 = (int)local_2a8 - 1;
          pQVar50 = local_2a8;
        }
        if (((int)uVar55 < 0) && (local_1d8._0_4_ != 0)) {
          QtPrivate::QPodArrayOps<_drmModeModeInfo>::emplace<_drmModeModeInfo_const&>
                    ((QPodArrayOps<_drmModeModeInfo> *)(auStack_300 + 0x48),(qsizetype)pQVar50,
                     (_drmModeModeInfo *)&local_1d8);
          QList<_drmModeModeInfo>::end((QList<_drmModeModeInfo> *)(auStack_300 + 0x48));
          uVar55 = (int)local_2a8 - 1;
        }
        if (bVar10) {
          local_3b8 = uVar55;
        }
        if (((int)local_3b8 < 0) && (local_3b8 = uVar57, (int)uVar57 < 0)) {
          local_3b8 = uVar44;
          if (-1 < (int)uVar55) {
            local_3b8 = uVar55;
          }
          if (-1 < (int)(uVar29 & uVar55)) goto LAB_00116ad1;
          createScreenForConnector((QKmsDevice *)&connectorName);
          pQVar40 = (QPlatformScreen *)0x0;
        }
        else {
LAB_00116ad1:
          this_02 = (QList<_drmModeModeInfo> *)(auStack_300 + 0x48);
          p_Var34 = QList<_drmModeModeInfo>::data(this_02);
          uVar1 = p_Var34[local_3b8].hdisplay;
          p_Var34 = QList<_drmModeModeInfo>::data(this_02);
          uVar2 = p_Var34[local_3b8].vdisplay;
          p_Var34 = QList<_drmModeModeInfo>::data(this_02);
          uVar45 = p_Var34[local_3b8].vrefresh;
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            uVar13 = local_218._0_8_;
            QVar71.m_data = (storage_type *)0xd;
            QVar71.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar71);
            QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
            piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QTextStream::operator<<((QTextStream *)local_218._0_8_,local_3b8);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            uVar13 = local_218._0_8_;
            QVar72.m_data = (storage_type *)0x1;
            QVar72.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar72);
            QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
            piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QTextStream::operator<<((QTextStream *)local_218._0_8_,(uint)uVar1);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            uVar13 = local_218._0_8_;
            QVar73.m_data = (storage_type *)0x1;
            QVar73.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar73);
            QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
            piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QTextStream::operator<<((QTextStream *)local_218._0_8_,(uint)uVar2);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QTextStream::operator<<((QTextStream *)local_218._0_8_,'@');
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QTextStream::operator<<((QTextStream *)local_218._0_8_,uVar45);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            uVar13 = local_218._0_8_;
            QVar74.m_data = (storage_type *)0xd;
            QVar74.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar74);
            QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
            piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            pcVar47 = connectorName.d.ptr;
            if (connectorName.d.ptr == (char *)0x0) {
              pcVar47 = (char *)&QByteArray::_empty;
            }
            QDebug::putByteArray(local_218,(ulong)pcVar47,(Latin1Content)connectorName.d.size);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QDebug::~QDebug((QDebug *)local_218);
          }
          iVar27 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_WIDTH",(bool *)0x0);
          if (iVar27 == 0) {
            iVar27 = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_WIDTH",(bool *)0x0);
          }
          iVar30 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_HEIGHT",(bool *)0x0);
          if (iVar30 == 0) {
            iVar30 = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_HEIGHT",(bool *)0x0);
          }
          auStack_300._56_8_ = (undefined8)iVar27;
          auStack_300._64_8_ = (undefined8)iVar30;
          if (iVar27 < 1 || iVar30 < 1) {
            auStack_300._24_8_ = (QArrayData *)0x0;
            auStack_300._32_8_ = L"physicalWidth";
            auStack_300._40_8_ = 0xd;
            local_1f8._16_4_ = 0;
            local_1f8._20_4_ = 0;
            local_1f8._0_4_ = 0;
            local_1f8._4_4_ = 0;
            local_1f8._8_4_ = 0;
            local_1f8._12_4_ = 0;
            local_1e0 = (char *)0x2;
            QMap<QString,_QVariant>::value
                      ((QVariant *)&local_188,&userConnectorConfig,(QString *)(auStack_300 + 0x18),
                       (QVariant *)&local_1f8);
            iVar27 = QVariant::toInt((bool *)local_188.data);
            local_310._8_8_ = (QArrayData *)0x0;
            auStack_300._0_8_ = L"physicalHeight";
            auStack_300._8_8_ = (QKmsScreenConfig *)0xe;
            local_238._16_8_ = 0;
            local_238._0_8_ = (QArrayData *)0x0;
            local_238._8_8_ = (char16_t *)0x0;
            local_220 = (Data *)0x2;
            QMap<QString,_QVariant>::value
                      ((QVariant *)local_218,&userConnectorConfig,(QString *)(local_310 + 8),
                       (QVariant *)local_238);
            iVar30 = QVariant::toInt((bool *)local_218);
            auStack_300._56_8_ = (undefined8)iVar27;
            auStack_300._64_8_ = (undefined8)iVar30;
            QVariant::~QVariant((QVariant *)local_218);
            QVariant::~QVariant((QVariant *)local_238);
            if ((QArrayData *)local_310._8_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_310._8_8_,2,0x10);
              }
            }
            QVariant::~QVariant((QVariant *)&local_188);
            QVariant::~QVariant((QVariant *)&local_1f8);
            if ((QArrayData *)auStack_300._24_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i
                   + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)auStack_300._24_8_,2,0x10);
              }
            }
            if (((double)auStack_300._56_8_ <= 0.0) || ((double)auStack_300._64_8_ <= 0.0)) {
              uVar43._0_4_ = connector->mmWidth;
              uVar43._4_4_ = connector->mmHeight;
              auVar60._0_8_ = uVar43 & 0xffffffff;
              auVar60._8_4_ = uVar43._4_4_;
              auVar60._12_4_ = 0;
              auStack_300._56_8_ = SUB168(auVar60 | _DAT_00127ac0,0) - (double)DAT_00127ac0;
              auStack_300._64_8_ = SUB168(auVar60 | _DAT_00127ac0,8) - DAT_00127ac0._8_8_;
            }
          }
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            uVar13 = local_238._0_8_;
            QVar75.m_data = (storage_type *)0x10;
            QVar75.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar75);
            QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
            piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_238._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_238._0_8_,' ');
            }
            local_310._0_8_ = local_238._0_8_;
            *(int *)(local_238._0_8_ + 0x28) = *(int *)(local_238._0_8_ + 0x28) + 1;
            operator<<((Stream *)local_218,(QSizeF *)local_310);
            uVar13 = local_218._0_8_;
            QVar76.m_data = (storage_type *)0x2;
            QVar76.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar76);
            QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
            piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            uVar13 = local_218._0_8_;
            QVar77.m_data = (storage_type *)0xa;
            QVar77.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar77);
            QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
            piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            pcVar47 = connectorName.d.ptr;
            if (connectorName.d.ptr == (char *)0x0) {
              pcVar47 = (char *)&QByteArray::_empty;
            }
            QDebug::putByteArray(local_218,(ulong)pcVar47,(Latin1Content)connectorName.d.size);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QDebug::~QDebug((QDebug *)local_218);
            QDebug::~QDebug((QDebug *)local_310);
            QDebug::~QDebug((QDebug *)local_238);
          }
          local_238._16_8_ = -0x5555555555555556;
          local_238._0_8_ = (QArrayData *)0xaaaaaaaaaaaaaaaa;
          local_238._8_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
          auStack_300._24_8_ = (QArrayData *)0x0;
          auStack_300._32_8_ = L"format";
          auStack_300._40_4_ = 6;
          auStack_300[0x2c] = false;
          auStack_300._45_3_ = 0;
          auStack_300._8_8_ = (QKmsScreenConfig *)0x0;
          local_310._8_8_ = (QArrayData *)0x0;
          auStack_300._0_8_ = (_func_int **)0x0;
          QVariant::QVariant((QVariant *)&local_1f8,(QString *)(local_310 + 8));
          QMap<QString,_QVariant>::value
                    ((QVariant *)&local_188,&userConnectorConfig,(QString *)(auStack_300 + 0x18),
                     (QVariant *)&local_1f8);
          QVariant::toByteArray();
          QByteArray::toLower_helper((QByteArray *)local_238);
          if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_218._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_218._0_8_,1,0x10);
            }
          }
          QVariant::~QVariant((QVariant *)&local_188);
          QVariant::~QVariant((QVariant *)&local_1f8);
          if ((QArrayData *)local_310._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_310._8_8_,2,0x10);
            }
          }
          if ((QArrayData *)auStack_300._24_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate((QArrayData *)auStack_300._24_8_,2,0x10);
            }
          }
          uVar29 = 0x34325258;
          if (local_238._16_8_ == 0) {
            cVar25 = '\0';
          }
          else {
            local_188._0_4_ = 0x127c76;
            local_188._4_4_ = 0;
            bVar23 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
            cVar25 = '\x01';
            if (!bVar23) {
              local_188._0_4_ = 0x127c7f;
              local_188._4_4_ = 0;
              bVar23 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
              uVar29 = 0x34324258;
              if (!bVar23) {
                local_188._0_4_ = 0x127c88;
                local_188._4_4_ = 0;
                bVar23 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
                uVar29 = 0x34325241;
                if (!bVar23) {
                  local_188._0_4_ = 0x127c91;
                  local_188._4_4_ = 0;
                  bVar23 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
                  uVar29 = 0x34324241;
                  if (!bVar23) {
                    local_188._0_4_ = 0x127c9a;
                    local_188._4_4_ = 0;
                    bVar23 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
                    uVar29 = 0x36314752;
                    if (!bVar23) {
                      local_188._0_4_ = 0x127ca1;
                      local_188._4_4_ = 0;
                      bVar23 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
                      uVar29 = 0x36314742;
                      if (!bVar23) {
                        local_188._0_4_ = 0x127ca8;
                        local_188._4_4_ = 0;
                        bVar23 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
                        uVar29 = 0x30335258;
                        if (!bVar23) {
                          local_188._0_4_ = 0x127cb4;
                          local_188._4_4_ = 0;
                          bVar23 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
                          uVar29 = 0x30334258;
                          if (!bVar23) {
                            local_188._0_4_ = 0x127cc0;
                            local_188._4_4_ = 0;
                            bVar23 = operator==((QByteArray *)local_238,(char **)&local_188.shared);
                            uVar29 = 0x30335241;
                            if (!bVar23) {
                              local_188._0_4_ = 0x127ccc;
                              local_188._4_4_ = 0;
                              bVar23 = operator==((QByteArray *)local_238,(char **)&local_188.shared
                                                 );
                              uVar29 = 0x30334241;
                              if (!bVar23) {
                                createScreenForConnector();
                                cVar25 = '\0';
                                uVar29 = 0x34325258;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            uVar13 = local_218._0_8_;
            QVar78.m_data = (storage_type *)0x9;
            QVar78.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar78);
            QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
            piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            Qt::hex((QTextStream *)local_218._0_8_);
            QTextStream::operator<<((QTextStream *)local_218._0_8_,uVar29);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            Qt::dec((QTextStream *)local_218._0_8_);
            uVar13 = local_218._0_8_;
            QVar79.m_data = (storage_type *)0x13;
            QVar79.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar79);
            QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
            piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            pcVar47 = "false";
            if (cVar25 != '\0') {
              pcVar47 = "true";
            }
            QTextStream::operator<<((QTextStream *)local_218._0_8_,pcVar47);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            uVar13 = local_218._0_8_;
            QVar80.m_data = (storage_type *)0xa;
            QVar80.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar80);
            QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
            piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            pcVar47 = connectorName.d.ptr;
            if (connectorName.d.ptr == (char *)0x0) {
              pcVar47 = (char *)&QByteArray::_empty;
            }
            QDebug::putByteArray(local_218,(ulong)pcVar47,(Latin1Content)connectorName.d.size);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QDebug::~QDebug((QDebug *)local_218);
          }
          auStack_300._40_8_ = -0x5555555555555556;
          auStack_300._24_8_ = (QArrayData *)0xaaaaaaaaaaaaaaaa;
          auStack_300._32_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
          local_218._0_8_ = (QArrayData *)0x0;
          local_218._8_8_ = L"clones";
          local_218._16_8_ = 6;
          local_1f8._16_4_ = 0;
          local_1f8._20_4_ = 0;
          local_1f8._0_4_ = 0;
          local_1f8._4_4_ = 0;
          local_1f8._8_4_ = 0;
          local_1f8._12_4_ = 0;
          local_1e0 = (char *)0x2;
          QMap<QString,_QVariant>::value
                    ((QVariant *)&local_188,&userConnectorConfig,(QString *)local_218,
                     (QVariant *)&local_1f8);
          QVariant::toString();
          QVariant::~QVariant((QVariant *)&local_188);
          QVariant::~QVariant((QVariant *)&local_1f8);
          if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_218._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
            }
          }
          if ((auStack_300._40_8_ != 0) &&
             (qLcKmsDebug(),
             ((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
             )) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            uVar13 = local_218._0_8_;
            QVar81.m_data = (storage_type *)0x6;
            QVar81.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar81);
            QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
            piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            pcVar47 = connectorName.d.ptr;
            if (connectorName.d.ptr == (char *)0x0) {
              pcVar47 = (char *)&QByteArray::_empty;
            }
            QDebug::putByteArray(local_218,(ulong)pcVar47,(Latin1Content)connectorName.d.size);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            uVar13 = local_218._0_8_;
            QVar82.m_data = (storage_type *)0xf;
            QVar82.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar82);
            QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
            piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            pcVar51 = (char16_t *)auStack_300._32_8_;
            if ((char16_t *)auStack_300._32_8_ == (char16_t *)0x0) {
              pcVar51 = (char16_t *)&QString::_empty;
            }
            QDebug::putString((QChar *)local_218,(ulong)pcVar51);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            QDebug::~QDebug((QDebug *)local_218);
          }
          local_318.wd.m_i = -1;
          local_318.ht.m_i = -1;
          auStack_300._8_8_ = (QKmsScreenConfig *)0xaaaaaaaaaaaaaaaa;
          local_310._8_8_ = (QArrayData *)0xaaaaaaaaaaaaaaaa;
          auStack_300._0_8_ = (_func_int **)0xaaaaaaaaaaaaaaaa;
          local_338.d.d = (Data *)0x0;
          local_338.d.ptr = L"size";
          local_338.d.size = 4;
          local_1f8._16_4_ = 0;
          local_1f8._20_4_ = 0;
          local_1f8._0_4_ = 0;
          local_1f8._4_4_ = 0;
          local_1f8._8_4_ = 0;
          local_1f8._12_4_ = 0;
          local_1e0 = (char *)0x2;
          QMap<QString,_QVariant>::value
                    ((QVariant *)&local_188,&userConnectorConfig,&local_338,(QVariant *)&local_1f8);
          QVariant::toByteArray();
          QByteArray::toLower_helper((QByteArray *)(local_310 + 8));
          if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_218._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_218._0_8_,1,0x10);
            }
          }
          QVariant::~QVariant((QVariant *)&local_188);
          QVariant::~QVariant((QVariant *)&local_1f8);
          if (&(local_338.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_338.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QKmsScreenConfig *)auStack_300._8_8_ == (QKmsScreenConfig *)0x0) {
LAB_00117c3f:
            p_Var34 = QList<_drmModeModeInfo>::data((QList<_drmModeModeInfo> *)(auStack_300 + 0x48))
            ;
            QVar11 = local_318;
            local_318.wd.m_i._2_2_ = 0;
            local_318.wd.m_i._0_2_ = p_Var34[local_3b8].hdisplay;
            local_318.ht = QVar11.ht.m_i;
            p_Var34 = QList<_drmModeModeInfo>::data((QList<_drmModeModeInfo> *)(auStack_300 + 0x48))
            ;
            local_318.ht.m_i._0_2_ = p_Var34[local_3b8].vdisplay;
            local_318.ht.m_i._2_2_ = 0;
          }
          else {
            pp_Var54 = (_func_int **)auStack_300._0_8_;
            if ((_func_int **)auStack_300._0_8_ == (_func_int **)0x0) {
              pp_Var54 = (_func_int **)&QByteArray::_empty;
            }
            iVar27 = __isoc99_sscanf(pp_Var54,"%dx%d",&local_318,&local_318.ht);
            if (iVar27 != 2) {
              createScreenForConnector((QKmsDevice *)auStack_300);
              goto LAB_00117c3f;
            }
            if (this->m_has_atomic_support == false) {
              createScreenForConnector();
              goto LAB_00117c3f;
            }
          }
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_188._0_4_ = 2;
            local_188._4_4_ = 0;
            local_188._8_4_ = 0;
            local_188._12_4_ = 0;
            local_188._16_4_ = 0;
            local_188._20_4_ = 0;
            uStack_170 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            uVar13 = local_218._0_8_;
            QVar83.m_data = (storage_type *)0x6;
            QVar83.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar83);
            QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
            piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            pcVar47 = connectorName.d.ptr;
            if (connectorName.d.ptr == (char *)0x0) {
              pcVar47 = (char *)&QByteArray::_empty;
            }
            QDebug::putByteArray(local_218,(ulong)pcVar47,(Latin1Content)connectorName.d.size);
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            uVar13 = local_218._0_8_;
            QVar84.m_data = (storage_type *)0x14;
            QVar84.m_size = (qsizetype)&local_1f8;
            QString::fromUtf8(QVar84);
            QTextStream::operator<<((QTextStream *)uVar13,(QString *)&local_1f8);
            piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_218._0_8_ + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_218._0_8_,' ');
            }
            local_348.wd.m_i = local_218._0_4_;
            local_348.ht.m_i = local_218._4_4_;
            *(int *)(local_218._0_8_ + 0x28) = *(int *)(local_218._0_8_ + 0x28) + 1;
            operator<<((Stream *)local_340,&local_348);
            QDebug::~QDebug((QDebug *)local_340);
            QDebug::~QDebug((QDebug *)&local_348);
            QDebug::~QDebug((QDebug *)local_218);
          }
          memcpy(&local_188,&DAT_001287f0,0x98);
          local_188._0_4_ = 0;
          local_188._4_4_ = 0;
          local_188._8_4_ = 0;
          local_188._12_4_ = 0;
          local_188._16_4_ = 0;
          local_188._20_4_ = 0;
          uStack_170 = (char *)0x0;
          local_168 = local_168 & 0xffffffff00000000;
          local_160 = (Data *)0xbff0000000000000;
          pQStack_158 = (QKmsPlane *)0xbff0000000000000;
          local_150 = 0xffffffffffffffff;
          uStack_148 = uStack_148 & 0xffffffffffffff00;
          local_140 = (drmModeCrtcPtr)0x0;
          auStack_138._0_8_ = (QArrayData *)0x0;
          auStack_138._8_8_ = (_drmModeModeInfo *)0x0;
          auStack_138._16_8_ = 0;
          local_120 = CONCAT44(local_120._4_4_,1);
          uStack_104 = 0;
          uStack_100 = uStack_100 & 0xffffff00;
          p_Stack_118 = (drmModePropertyPtr)0x0;
          local_110 = (drmModePropertyBlobPtr)0x0;
          uStack_108 = uStack_108 & 0xffffff00;
          uStack_fc = 0x34325258;
          cStack_f8 = 0;
          QStack_f0.d.d._0_4_ = 0;
          QStack_f0.d.d._4_4_ = 0;
          QStack_f0.d.ptr._0_1_ = 0;
          QStack_f0.d.ptr._1_7_ = 0;
          QStack_f0.d.size = 0;
          auStack_d8._0_8_ = (Data *)0x0;
          auStack_d8._8_8_ = (QKmsPlane *)0x0;
          auStack_d8._16_8_ = 0;
          local_c0 = (QKmsPlane *)0x0;
          QStack_b8.wd.m_i = -1;
          QStack_b8.ht.m_i = -1;
          local_b0 = (QKmsPlane *)0x0;
          QStack_a8.wd.m_i = 0;
          QStack_a8.ht.m_i = 0;
          QVar85.m_data = (storage_type *)connectorName.d.size;
          QVar85.m_size = (qsizetype)&local_1f8;
          QString::fromUtf8(QVar85);
          uVar21 = local_188._12_4_;
          uVar20 = local_188._8_4_;
          uVar19 = local_188._4_4_;
          uVar18 = local_188._0_4_;
          uVar17 = local_1f8._20_4_;
          uVar16 = local_1f8._16_4_;
          uVar15 = local_1f8._4_4_;
          uVar14 = local_1f8._0_4_;
          piVar37 = (int *)CONCAT44(local_188._4_4_,local_188._0_4_);
          local_1f8._0_4_ = local_188._0_4_;
          local_1f8._4_4_ = local_188._4_4_;
          local_188._0_4_ = uVar14;
          local_188._4_4_ = uVar15;
          local_188._8_4_ = local_1f8._8_4_;
          local_188._12_4_ = local_1f8._12_4_;
          local_1f8._8_4_ = uVar20;
          local_1f8._12_4_ = uVar21;
          local_1f8._16_4_ = local_188._16_4_;
          local_1f8._20_4_ = local_188._20_4_;
          local_188._16_4_ = uVar16;
          local_188._20_4_ = uVar17;
          if (piVar37 != (int *)0x0) {
            LOCK();
            *piVar37 = *piVar37 + -1;
            UNLOCK();
            if (*piVar37 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(uVar19,uVar18),2,0x10);
            }
          }
          uStack_170 = (char *)CONCAT44(uVar26,connector->connector_id);
          local_168 = CONCAT44(local_168._4_4_,uVar28);
          local_160 = (Data *)auStack_300._56_8_;
          pQStack_158 = (QKmsPlane *)auStack_300._64_8_;
          if ((int)uVar57 < 0) {
            uVar57 = local_3b8;
          }
          local_150 = CONCAT44(local_3b8,uVar57);
          uStack_148 = uStack_148 & 0xffffffffffffff00;
          local_140 = (drmModeCrtcPtr)drmModeGetCrtc(this->m_dri_fd);
          uVar13 = auStack_138._0_8_;
          if ((QArrayData *)auStack_300._72_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)auStack_300._72_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)auStack_300._72_8_)->_q_value).super___atomic_base<int>._M_i +
                 1;
            UNLOCK();
          }
          auStack_138._0_8_ = auStack_300._72_8_;
          auStack_138._8_8_ = p_Stack_2b0;
          auStack_138._16_8_ = local_2a8;
          if ((QArrayData *)uVar13 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar13,0x44,0x10);
            }
          }
          local_120 = CONCAT44(local_120._4_4_,connector->subpixel);
          local_1f8._0_4_ = 0;
          local_1f8._4_4_ = 0;
          local_1f8._8_4_ = 0x127da7;
          local_1f8._12_4_ = 0;
          local_1f8._16_4_ = 4;
          local_1f8._20_4_ = 0;
          p_Stack_118 = connectorProperty(this,connector,(QByteArray *)&local_1f8);
          local_1f8._0_4_ = 0;
          local_1f8._4_4_ = 0;
          local_1f8._8_4_ = 0x127dac;
          local_1f8._12_4_ = 0;
          local_1f8._16_4_ = 4;
          local_1f8._20_4_ = 0;
          local_110 = connectorPropertyBlob(this,connector,(QByteArray *)&local_1f8);
          uStack_108 = uStack_108 & 0xffffff00;
          uStack_104 = 0;
          uStack_100 = uStack_100 & 0xffffff00;
          uStack_fc = uVar29;
          cStack_f8 = cVar25;
          QString::operator=(&QStack_f0,(QString *)(auStack_300 + 0x18));
          QStack_b8 = local_318;
          iVar27 = this->m_dri_fd;
          p_Var34 = QList<_drmModeModeInfo>::data((QList<_drmModeModeInfo> *)(auStack_300 + 0x48));
          iVar27 = drmModeCreatePropertyBlob(iVar27,p_Var34 + local_3b8,0x44,&QStack_a8.ht);
          if ((iVar27 != 0) &&
             (qLcKmsDebug(),
             ((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
             )) {
            local_1f8._0_4_ = 2;
            local_1f8._4_4_ = 0;
            local_1f8._8_4_ = 0;
            local_1f8._12_4_ = 0;
            local_1f8._16_4_ = 0;
            local_1f8._20_4_ = 0;
            local_1e0 = qLcKmsDebug::category.name;
            QMessageLogger::debug();
            pDVar5 = local_338.d.d;
            QVar86.m_data = (storage_type *)0x23;
            QVar86.m_size = (qsizetype)local_218;
            QString::fromUtf8(QVar86);
            QTextStream::operator<<((QTextStream *)pDVar5,(QString *)local_218);
            if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
              UNLOCK();
              if (*(int *)local_218._0_8_ == 0) {
                QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
              }
            }
            if ((char)local_338.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i
                == '\x01') {
              QTextStream::operator<<((QTextStream *)local_338.d.d,' ');
            }
            QTextStream::operator<<((QTextStream *)local_338.d.d,local_3b8);
            if ((char)local_338.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i
                == '\x01') {
              QTextStream::operator<<((QTextStream *)local_338.d.d,' ');
            }
            QDebug::~QDebug((QDebug *)&local_338);
          }
          parseConnectorProperties(this,(uint32_t)uStack_170,(QKmsOutput *)&local_188);
          parseCrtcProperties(this,(uint32_t)local_168,(QKmsOutput *)&local_188);
          local_218._0_8_ = (QArrayData *)0x0;
          local_218._8_8_ = (char16_t *)0x0;
          local_218._16_8_ = 0;
          this_01 = &this->m_planes;
          iVar35 = QList<QKmsPlane>::begin(this_01);
          iVar36 = QList<QKmsPlane>::end(this_01);
          if (iVar35.i != iVar36.i) {
            do {
              if (((uint)(iVar35.i)->possibleCrtcs >> (uStack_170._4_4_ & 0x1f) & 1) != 0) {
                QtPrivate::QGenericArrayOps<QKmsPlane>::emplace<QKmsPlane_const&>
                          ((QGenericArrayOps<QKmsPlane> *)auStack_d8,auStack_d8._16_8_,iVar35.i);
                QList<QKmsPlane>::end((QList<QKmsPlane> *)auStack_d8);
                QString::number((uint)&local_1f8,(iVar35.i)->id);
                QString::append((QString *)local_218);
                piVar37 = (int *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
                if (piVar37 != (int *)0x0) {
                  LOCK();
                  *piVar37 = *piVar37 + -1;
                  UNLOCK();
                  if (*piVar37 == 0) {
                    QArrayData::deallocate
                              ((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),2,0x10);
                  }
                }
                QString::append((QChar)(char16_t)(QString *)local_218);
                if (((local_c0 == (QKmsPlane *)0x0) && ((iVar35.i)->type == PrimaryPlane)) &&
                   ((iVar35.i)->activeCrtcId == 0)) {
                  (iVar35.i)->activeCrtcId = (uint32_t)local_168;
                  local_c0 = iVar35.i;
                }
              }
              iVar35.i = iVar35.i + 1;
            } while (iVar35.i != iVar36.i);
          }
          qLcKmsDebug();
          uVar13 = auStack_d8._16_8_;
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_1f8._0_4_ = 2;
            local_1f8._4_4_ = 0;
            local_1f8._8_4_ = 0;
            local_1f8._12_4_ = 0;
            local_1f8._16_4_ = 0;
            local_1f8._20_4_ = 0;
            pcVar47 = connectorName.d.ptr;
            if (connectorName.d.ptr == (char *)0x0) {
              pcVar47 = (char *)&QByteArray::_empty;
            }
            local_1e0 = qLcKmsDebug::category.name;
            QString::toLocal8Bit_helper((QChar *)&local_338,local_218._8_8_);
            pcVar51 = local_338.d.ptr;
            if (local_338.d.ptr == (char16_t *)0x0) {
              pcVar51 = (char16_t *)&QByteArray::_empty;
            }
            QMessageLogger::debug
                      ((char *)local_1f8.data,"Output %s can use %d planes: %s",pcVar47,
                       uVar13 & 0xffffffff,pcVar51);
            if (&(local_338.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_338.d.d)->super_QArrayData,1,0x10);
              }
            }
          }
          ok = true;
          uVar26 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_PLANE_INDEX",&ok);
          if ((ok != false) &&
             (piVar37 = (int *)drmModeGetPlaneResources(this->m_dri_fd), piVar37 != (int *)0x0)) {
            if (((int)uVar26 < 0) || (*piVar37 <= (int)uVar26)) {
              local_1f8._0_4_ = 2;
              local_1f8._4_4_ = 0;
              local_1f8._8_4_ = 0;
              local_1f8._12_4_ = 0;
              local_1f8._16_4_ = 0;
              local_1f8._20_4_ = 0;
              local_1e0 = "default";
              QMessageLogger::warning
                        ((char *)local_1f8.data,"Invalid plane index %d, must be between 0 and %u",
                         (ulong)uVar26,(ulong)(*piVar37 - 1));
            }
            else {
              lVar32 = drmModeGetPlane(this->m_dri_fd,
                                       *(undefined4 *)(*(long *)(piVar37 + 2) + (ulong)uVar26 * 4));
              if (lVar32 != 0) {
                uStack_108 = CONCAT31(uStack_108._1_3_,1);
                uStack_104 = *(uint32_t *)(lVar32 + 0x10);
                qLcKmsDebug();
                if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
                    1) != 0) {
                  local_1f8._0_4_ = 2;
                  local_1f8._4_4_ = 0;
                  local_1f8._8_4_ = 0;
                  local_1f8._12_4_ = 0;
                  local_1f8._16_4_ = 0;
                  local_1f8._20_4_ = 0;
                  local_1e0 = qLcKmsDebug::category.name;
                  QMessageLogger::debug
                            ((char *)local_1f8.data,
                             "Forcing plane index %d, plane id %u (belongs to crtc id %u)",
                             (ulong)uVar26,(ulong)*(uint *)(lVar32 + 0x10),
                             (ulong)*(uint *)(lVar32 + 0x14));
                }
                iVar35 = QList<QKmsPlane>::begin(this_01);
                iVar36 = QList<QKmsPlane>::end(this_01);
                for (; iVar35.i != iVar36.i; iVar35.i = iVar35.i + 1) {
                  if ((iVar35.i)->id == uStack_104) {
                    if (local_c0 != (QKmsPlane *)0x0) {
                      local_c0->activeCrtcId = 0;
                    }
                    (iVar35.i)->activeCrtcId = (uint32_t)local_168;
                    local_c0 = iVar35.i;
                    break;
                  }
                }
                drmModeFreePlane(lVar32);
              }
            }
          }
          cVar25 = qEnvironmentVariableIsSet("QT_QPA_EGLFS_KMS_PLANES_FOR_CRTCS");
          if (cVar25 != '\0') {
            local_338.d.size = -0x5555555555555556;
            local_338.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_338.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            qEnvironmentVariable((char *)&local_338);
            qLcKmsDebug();
            if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                != 0) {
              local_1f8._0_4_ = 2;
              local_1f8._4_4_ = 0;
              local_1f8._8_4_ = 0;
              local_1f8._12_4_ = 0;
              local_1f8._16_4_ = 0;
              local_1f8._20_4_ = 0;
              local_1e0 = qLcKmsDebug::category.name;
              QString::toLocal8Bit_helper((QChar *)&local_368,(longlong)local_338.d.ptr);
              pQVar41 = local_368.ptr;
              if (local_368.ptr == (QString *)0x0) {
                pQVar41 = (QString *)&QByteArray::_empty;
              }
              QMessageLogger::debug
                        ((char *)local_1f8.data,"crtc_id:plane_id override list: %s",pQVar41);
              if (&(local_368.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_368.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_368.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_368.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_368.d)->super_QArrayData,1,0x10);
                }
              }
            }
            local_1f8._16_4_ = 0xaaaaaaaa;
            local_1f8._20_4_ = 0xaaaaaaaa;
            local_1f8._0_4_ = 0xaaaaaaaa;
            local_1f8._4_4_ = 0xaaaaaaaa;
            local_1f8._8_4_ = 0xaaaaaaaa;
            local_1f8._12_4_ = 0xaaaaaaaa;
            QString::split(&local_1f8,&local_338,0x3a,0,1);
            if (CONCAT44(local_1f8._20_4_,local_1f8._16_4_) != 0) {
              lVar33 = CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
              lVar32 = lVar33 + CONCAT44(local_1f8._20_4_,local_1f8._16_4_) * 0x18;
              do {
                local_368.size = -0x5555555555555556;
                local_368.d = (Data *)0xaaaaaaaaaaaaaaaa;
                local_368.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
                QString::split(&local_368,lVar33,0x2c,0,1);
                if (local_368.size == 2) {
                  QVar87.m_data = ((local_368.ptr)->d).ptr;
                  QVar87.m_size = ((local_368.ptr)->d).size;
                  lVar38 = QString::toIntegral_helper(QVar87,(bool *)0x0,10);
                  iVar27 = (int)lVar38;
                  if ((int)lVar38 != lVar38) {
                    iVar27 = 0;
                  }
                  if (iVar27 == (uint32_t)local_168) {
                    QVar88.m_data = local_368.ptr[1].d.ptr;
                    QVar88.m_size = local_368.ptr[1].d.size;
                    lVar38 = QString::toIntegral_helper(QVar88,(bool *)0x0,10);
                    uVar45 = (uint32_t)lVar38;
                    if ((int)(uint32_t)lVar38 != lVar38) {
                      uVar45 = 0;
                    }
                    iVar35 = QList<QKmsPlane>::begin(this_01);
                    iVar36 = QList<QKmsPlane>::end(this_01);
                    for (; iVar35.i != iVar36.i; iVar35.i = iVar35.i + 1) {
                      if ((iVar35.i)->id == uVar45) {
                        if (local_c0 != (QKmsPlane *)0x0) {
                          local_c0->activeCrtcId = 0;
                        }
                        (iVar35.i)->activeCrtcId = (uint32_t)local_168;
                        local_c0 = iVar35.i;
                        break;
                      }
                    }
                  }
                }
                QArrayDataPointer<QString>::~QArrayDataPointer(&local_368);
                lVar33 = lVar33 + 0x18;
              } while (lVar33 != lVar32);
            }
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_1f8)
            ;
            if (&(local_338.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_338.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          if (local_c0 == (QKmsPlane *)0x0) {
            pQVar39 = (QKmsPlane *)0x0;
          }
          else {
            qLcKmsDebug();
            pQVar39 = local_c0;
            if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                != 0) {
              local_1f8._0_4_ = 2;
              local_1f8._4_4_ = 0;
              local_1f8._8_4_ = 0;
              local_1f8._12_4_ = 0;
              local_1f8._16_4_ = 0;
              local_1f8._20_4_ = 0;
              local_1e0 = qLcKmsDebug::category.name;
              pcVar47 = connectorName.d.ptr;
              if (connectorName.d.ptr == (char *)0x0) {
                pcVar47 = (char *)&QByteArray::_empty;
              }
              QMessageLogger::debug
                        ((char *)local_1f8.data,
                         "Chose plane %u for output %s (crtc id %u) (may not be applicable)",
                         (ulong)local_c0->id,pcVar47,local_168 & 0xffffffff);
              pQVar39 = local_c0;
            }
          }
          if (((this->m_has_atomic_support == true) && (pQVar39 == (QKmsPlane *)0x0)) &&
             (qLcKmsDebug(),
             ((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
             )) {
            local_1f8._0_4_ = 2;
            local_1f8._4_4_ = 0;
            local_1f8._8_4_ = 0;
            local_1f8._12_4_ = 0;
            local_1f8._16_4_ = 0;
            local_1f8._20_4_ = 0;
            local_1e0 = qLcKmsDebug::category.name;
            pcVar47 = connectorName.d.ptr;
            if (connectorName.d.ptr == (char *)0x0) {
              pcVar47 = (char *)&QByteArray::_empty;
            }
            QMessageLogger::debug
                      ((char *)local_1f8.data,
                       "No plane associated with output %s (crtc id %u) and atomic modesetting is enabled. This is bad."
                       ,pcVar47,local_168 & 0xffffffff);
          }
          this->m_crtc_allocator = this->m_crtc_allocator | 1 << (uStack_170._4_1_ & 0x1f);
          QString::operator=(&(vinfo->output).name,(QString *)&local_188);
          *(char **)&(vinfo->output).connector_id = uStack_170;
          *(ulong *)&(vinfo->output).crtc_id = local_168;
          (vinfo->output).physical_size.wd = (qreal)local_160;
          (vinfo->output).physical_size.ht = (qreal)pQStack_158;
          (vinfo->output).preferred_mode = (undefined4)local_150;
          (vinfo->output).mode = local_150._4_4_;
          *(ulong *)&(vinfo->output).mode_set = uStack_148;
          (vinfo->output).saved_crtc = local_140;
          QArrayDataPointer<_drmModeModeInfo>::operator=
                    (&this_00->d,(QArrayDataPointer<_drmModeModeInfo> *)auStack_138);
          *(undefined8 *)&(vinfo->output).subpixel = local_120;
          (vinfo->output).dpms_prop = p_Stack_118;
          (vinfo->output).edid_blob = local_110;
          (vinfo->output).wants_forced_plane = (bool)(char)uStack_108;
          *(int3 *)&(vinfo->output).field_0x81 = (int3)(uStack_108 >> 8);
          (vinfo->output).forced_plane_id = uStack_104;
          *(ulong *)&(vinfo->output).field_0x81 =
               CONCAT17((undefined1)uStack_100,CONCAT43(uStack_104,uStack_108._1_3_));
          *(ulong *)&(vinfo->output).field_0x89 =
               CONCAT17(cStack_f8,CONCAT43(uStack_fc,uStack_100._1_3_));
          QString::operator=(&(vinfo->output).clone_source,&QStack_f0);
          QArrayDataPointer<QKmsPlane>::operator=
                    (&(vinfo->output).available_planes.d,(QArrayDataPointer<QKmsPlane> *)auStack_d8)
          ;
          (vinfo->output).eglfs_plane = local_c0;
          (vinfo->output).size = QStack_b8;
          (vinfo->output).crtcIdPropertyId = (uint32_t)local_b0;
          (vinfo->output).modeIdPropertyId = local_b0._4_4_;
          (vinfo->output).activePropertyId = QStack_a8.wd.m_i;
          (vinfo->output).mode_blob_id = QStack_a8.ht.m_i;
          iVar27 = (*this->_vptr_QKmsDevice[5])(this,&local_188);
          pQVar40 = (QPlatformScreen *)CONCAT44(extraout_var,iVar27);
          if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_218._0_8_ = *(int *)local_218._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_218._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
            }
          }
          QArrayDataPointer<QKmsPlane>::~QArrayDataPointer
                    ((QArrayDataPointer<QKmsPlane> *)auStack_d8);
          piVar37 = (int *)CONCAT44(QStack_f0.d.d._4_4_,(uint)QStack_f0.d.d);
          if (piVar37 != (int *)0x0) {
            LOCK();
            *piVar37 = *piVar37 + -1;
            UNLOCK();
            if (*piVar37 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(QStack_f0.d.d._4_4_,(uint)QStack_f0.d.d),2,0x10);
            }
          }
          if ((QArrayData *)auStack_138._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)auStack_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)auStack_138._0_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)auStack_138._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate((QArrayData *)auStack_138._0_8_,0x44,0x10);
            }
          }
          piVar37 = (int *)CONCAT44(local_188._4_4_,local_188._0_4_);
          if (piVar37 != (int *)0x0) {
            LOCK();
            *piVar37 = *piVar37 + -1;
            UNLOCK();
            if (*piVar37 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(local_188._4_4_,local_188._0_4_),2,0x10)
              ;
            }
          }
          if ((QArrayData *)local_310._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_310._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_310._8_8_,1,0x10);
            }
          }
          if ((QArrayData *)auStack_300._24_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)auStack_300._24_8_)->_q_value).super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate((QArrayData *)auStack_300._24_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_238._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_238._0_8_ = *(int *)local_238._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_238._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_238._0_8_,1,0x10);
            }
          }
        }
        if ((QArrayData *)auStack_300._72_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)auStack_300._72_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)auStack_300._72_8_)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)auStack_300._72_8_)->_q_value).super___atomic_base<int>._M_i == 0
             ) {
            QArrayData::deallocate((QArrayData *)auStack_300._72_8_,0x44,0x10);
          }
        }
        goto LAB_0011681c;
      }
      qLcKmsDebug();
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_188._0_4_ = 2;
        local_188._4_4_ = 0;
        local_188._8_4_ = 0;
        local_188._12_4_ = 0;
        local_188._16_4_ = 0;
        local_188._20_4_ = 0;
        uStack_170 = qLcKmsDebug::category.name;
        QMessageLogger::debug();
        pQVar42 = (QTextStream *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
        psVar48 = (storage_type *)0xf;
        goto LAB_00116095;
      }
    }
LAB_0011681a:
    pQVar40 = (QPlatformScreen *)0x0;
  }
LAB_0011681c:
  if (&(local_298.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_298.d.d)->super_QArrayData,1,0x10);
    }
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&userConnectorConfig.d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
              *)local_270);
LAB_0011685f:
  if (connectorName.d.d != (Data *)0x0) {
    LOCK();
    ((connectorName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((connectorName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((connectorName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(connectorName.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return pQVar40;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformScreen *QKmsDevice::createScreenForConnector(drmModeResPtr resources,
                                                      drmModeConnectorPtr connector,
                                                      ScreenInfo *vinfo)
{
    Q_ASSERT(vinfo);
    const QByteArray connectorName = nameForConnector(connector);

    const int crtc = crtcForConnector(resources, connector);
    if (crtc < 0) {
        qWarning() << "No usable crtc/encoder pair for connector" << connectorName;
        return nullptr;
    }

    OutputConfiguration configuration;
    QSize configurationSize;
    int configurationRefresh = 0;
    drmModeModeInfo configurationModeline;

    auto userConfig = m_screenConfig->outputSettings();
    QVariantMap userConnectorConfig = userConfig.value(QString::fromUtf8(connectorName));
    // default to the preferred mode unless overridden in the config
    const QByteArray mode = userConnectorConfig.value(QStringLiteral("mode"), QStringLiteral("preferred"))
        .toByteArray().toLower();
    if (mode == "off") {
        configuration = OutputConfigOff;
    } else if (mode == "preferred") {
        configuration = OutputConfigPreferred;
    } else if (mode == "current") {
        configuration = OutputConfigCurrent;
    } else if (mode == "skip") {
        configuration = OutputConfigSkip;
    } else if (sscanf(mode.constData(), "%dx%d@%d", &configurationSize.rwidth(), &configurationSize.rheight(),
                      &configurationRefresh) == 3)
    {
        configuration = OutputConfigMode;
    } else if (sscanf(mode.constData(), "%dx%d", &configurationSize.rwidth(), &configurationSize.rheight()) == 2) {
        configuration = OutputConfigMode;
    } else if (parseModeline(mode, &configurationModeline)) {
        configuration = OutputConfigModeline;
    } else {
        qWarning("Invalid mode \"%s\" for output %s", mode.constData(), connectorName.constData());
        configuration = OutputConfigPreferred;
    }

    *vinfo = ScreenInfo();
    vinfo->virtualIndex = userConnectorConfig.value(QStringLiteral("virtualIndex"), INT_MAX).toInt();
    if (userConnectorConfig.contains(QStringLiteral("virtualPos"))) {
        const QByteArray vpos = userConnectorConfig.value(QStringLiteral("virtualPos")).toByteArray();
        const QByteArrayList vposComp = vpos.split(',');
        if (vposComp.size() == 2)
            vinfo->virtualPos = QPoint(vposComp[0].trimmed().toInt(), vposComp[1].trimmed().toInt());
    }
    if (userConnectorConfig.value(QStringLiteral("primary")).toBool())
        vinfo->isPrimary = true;

    const uint32_t crtc_id = resources->crtcs[crtc];

    if (configuration == OutputConfigOff) {
        qCDebug(qLcKmsDebug) << "Turning off output" << connectorName;
        drmModeSetCrtc(m_dri_fd, crtc_id, 0, 0, 0, 0, 0, nullptr);
        return nullptr;
    }

    // Skip disconnected output
    if (configuration == OutputConfigPreferred && connector->connection == DRM_MODE_DISCONNECTED) {
        qCDebug(qLcKmsDebug) << "Skipping disconnected output" << connectorName;
        return nullptr;
    }

    if (configuration == OutputConfigSkip) {
        qCDebug(qLcKmsDebug) << "Skipping output" << connectorName;
        return nullptr;
    }

    // Get the current mode on the current crtc
    drmModeModeInfo crtc_mode;
    memset(&crtc_mode, 0, sizeof crtc_mode);
    if (drmModeEncoderPtr encoder = drmModeGetEncoder(m_dri_fd, connector->encoder_id)) {
        drmModeCrtcPtr crtc = drmModeGetCrtc(m_dri_fd, encoder->crtc_id);
        drmModeFreeEncoder(encoder);

        if (!crtc)
            return nullptr;

        if (crtc->mode_valid)
            crtc_mode = crtc->mode;

        drmModeFreeCrtc(crtc);
    }

    QList<drmModeModeInfo> modes;
    modes.reserve(connector->count_modes);
    qCDebug(qLcKmsDebug) << connectorName << "mode count:" << connector->count_modes
                         << "crtc index:" << crtc << "crtc id:" << crtc_id;
    for (int i = 0; i < connector->count_modes; i++) {
        const drmModeModeInfo &mode = connector->modes[i];
        qCDebug(qLcKmsDebug) << "mode" << i << mode.hdisplay << "x" << mode.vdisplay
                                  << '@' << mode.vrefresh << "hz";
        modes << connector->modes[i];
    }

    int preferred = -1;
    int current = -1;
    int configured = -1;
    int best = -1;

    for (int i = modes.size() - 1; i >= 0; i--) {
        const drmModeModeInfo &m = modes.at(i);

        if (configuration == OutputConfigMode
                && m.hdisplay == configurationSize.width()
                && m.vdisplay == configurationSize.height()
                && (!configurationRefresh || m.vrefresh == uint32_t(configurationRefresh)))
        {
            configured = i;
        }

        if (!memcmp(&crtc_mode, &m, sizeof m))
            current = i;

        if (m.type & DRM_MODE_TYPE_PREFERRED)
            preferred = i;

        best = i;
    }

    if (configuration == OutputConfigModeline) {
        modes << configurationModeline;
        configured = modes.size() - 1;
    }

    if (current < 0 && crtc_mode.clock != 0) {
        modes << crtc_mode;
        current = modes.size() - 1;
    }

    if (configuration == OutputConfigCurrent)
        configured = current;

    int selected_mode = -1;

    if (configured >= 0)
        selected_mode = configured;
    else if (preferred >= 0)
        selected_mode = preferred;
    else if (current >= 0)
        selected_mode = current;
    else if (best >= 0)
        selected_mode = best;

    if (selected_mode < 0) {
        qWarning() << "No modes available for output" << connectorName;
        return nullptr;
    } else {
        int width = modes[selected_mode].hdisplay;
        int height = modes[selected_mode].vdisplay;
        int refresh = modes[selected_mode].vrefresh;
        qCDebug(qLcKmsDebug) << "Selected mode" << selected_mode << ":" << width << "x" << height
                                  << '@' << refresh << "hz for output" << connectorName;
    }

    // physical size from connector < config values < env vars
    int pwidth = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_WIDTH");
    if (!pwidth)
        pwidth = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_WIDTH");
    int pheight = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_HEIGHT");
    if (!pheight)
        pheight = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_HEIGHT");
    QSizeF physSize(pwidth, pheight);
    if (physSize.isEmpty()) {
        physSize = QSize(userConnectorConfig.value(QStringLiteral("physicalWidth")).toInt(),
                         userConnectorConfig.value(QStringLiteral("physicalHeight")).toInt());
        if (physSize.isEmpty()) {
            physSize.setWidth(connector->mmWidth);
            physSize.setHeight(connector->mmHeight);
        }
    }
    qCDebug(qLcKmsDebug) << "Physical size is" << physSize << "mm" << "for output" << connectorName;

    const QByteArray formatStr = userConnectorConfig.value(QStringLiteral("format"), QString())
            .toByteArray().toLower();
    uint32_t drmFormat;
    bool drmFormatExplicit = true;
    if (formatStr.isEmpty()) {
        drmFormat = DRM_FORMAT_XRGB8888;
        drmFormatExplicit = false;
    } else if (formatStr == "xrgb8888") {
        drmFormat = DRM_FORMAT_XRGB8888;
    } else if (formatStr == "xbgr8888") {
        drmFormat = DRM_FORMAT_XBGR8888;
    } else if (formatStr == "argb8888") {
        drmFormat = DRM_FORMAT_ARGB8888;
    } else if (formatStr == "abgr8888") {
        drmFormat = DRM_FORMAT_ABGR8888;
    } else if (formatStr == "rgb565") {
        drmFormat = DRM_FORMAT_RGB565;
    } else if (formatStr == "bgr565") {
        drmFormat = DRM_FORMAT_BGR565;
    } else if (formatStr == "xrgb2101010") {
        drmFormat = DRM_FORMAT_XRGB2101010;
    } else if (formatStr == "xbgr2101010") {
        drmFormat = DRM_FORMAT_XBGR2101010;
    } else if (formatStr == "argb2101010") {
        drmFormat = DRM_FORMAT_ARGB2101010;
    } else if (formatStr == "abgr2101010") {
        drmFormat = DRM_FORMAT_ABGR2101010;
    } else {
        qWarning("Invalid pixel format \"%s\" for output %s", formatStr.constData(), connectorName.constData());
        drmFormat = DRM_FORMAT_XRGB8888;
        drmFormatExplicit = false;
    }
    qCDebug(qLcKmsDebug) << "Format is" << Qt::hex << drmFormat << Qt::dec << "requested_by_user =" << drmFormatExplicit
                         << "for output" << connectorName;

    const QString cloneSource = userConnectorConfig.value(QStringLiteral("clones")).toString();
    if (!cloneSource.isEmpty())
        qCDebug(qLcKmsDebug) << "Output" << connectorName << " clones output " << cloneSource;

    QSize framebufferSize;
    bool framebufferSizeSet = false;
    const QByteArray fbsize = userConnectorConfig.value(QStringLiteral("size")).toByteArray().toLower();
    if (!fbsize.isEmpty()) {
        if (sscanf(fbsize.constData(), "%dx%d", &framebufferSize.rwidth(), &framebufferSize.rheight()) == 2) {
#if QT_CONFIG(drm_atomic)
            if (hasAtomicSupport())
                framebufferSizeSet = true;
#endif
            if (!framebufferSizeSet)
                qWarning("Setting framebuffer size is only available with DRM atomic API");
        } else {
            qWarning("Invalid framebuffer size '%s'", fbsize.constData());
        }
    }
    if (!framebufferSizeSet) {
        framebufferSize.setWidth(modes[selected_mode].hdisplay);
        framebufferSize.setHeight(modes[selected_mode].vdisplay);
    }

    qCDebug(qLcKmsDebug) << "Output" << connectorName << "framebuffer size is " << framebufferSize;

    QKmsOutput output;
    output.name = QString::fromUtf8(connectorName);
    output.connector_id = connector->connector_id;
    output.crtc_index = crtc;
    output.crtc_id = crtc_id;
    output.physical_size = physSize;
    output.preferred_mode = preferred >= 0 ? preferred : selected_mode;
    output.mode = selected_mode;
    output.mode_set = false;
    output.saved_crtc = drmModeGetCrtc(m_dri_fd, crtc_id);
    output.modes = modes;
    output.subpixel = connector->subpixel;
    output.dpms_prop = connectorProperty(connector, QByteArrayLiteral("DPMS"));
    output.edid_blob = connectorPropertyBlob(connector, QByteArrayLiteral("EDID"));
    output.wants_forced_plane = false;
    output.forced_plane_id = 0;
    output.forced_plane_set = false;
    output.drm_format = drmFormat;
    output.drm_format_requested_by_user = drmFormatExplicit;
    output.clone_source = cloneSource;
    output.size = framebufferSize;

#if QT_CONFIG(drm_atomic)
    if (drmModeCreatePropertyBlob(m_dri_fd, &modes[selected_mode], sizeof(drmModeModeInfo),
                                  &output.mode_blob_id) != 0) {
        qCDebug(qLcKmsDebug) << "Failed to create mode blob for mode" << selected_mode;
    }

    parseConnectorProperties(output.connector_id, &output);
    parseCrtcProperties(output.crtc_id, &output);
#endif

    QString planeListStr;
    for (QKmsPlane &plane : m_planes) {
        if (plane.possibleCrtcs & (1 << output.crtc_index)) {
            output.available_planes.append(plane);
            planeListStr.append(QString::number(plane.id));
            planeListStr.append(u' ');

            // Choose the first primary plane that is not already assigned to
            // another screen's associated crtc.
            if (!output.eglfs_plane && plane.type == QKmsPlane::PrimaryPlane && !plane.activeCrtcId)
                assignPlane(&output, &plane);
        }
    }
    qCDebug(qLcKmsDebug, "Output %s can use %d planes: %s",
            connectorName.constData(), int(output.available_planes.size()), qPrintable(planeListStr));

    // This is for the EGLDevice/EGLStream backend. On some of those devices one
    // may want to target a pre-configured plane. It is probably useless for
    // eglfs_kms and others. Do not confuse with generic plane support (available_planes).
    bool ok;
    int idx = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_PLANE_INDEX", &ok);
    if (ok) {
        drmModePlaneRes *planeResources = drmModeGetPlaneResources(m_dri_fd);
        if (planeResources) {
            if (idx >= 0 && idx < int(planeResources->count_planes)) {
                drmModePlane *plane = drmModeGetPlane(m_dri_fd, planeResources->planes[idx]);
                if (plane) {
                    output.wants_forced_plane = true;
                    output.forced_plane_id = plane->plane_id;
                    qCDebug(qLcKmsDebug, "Forcing plane index %d, plane id %u (belongs to crtc id %u)",
                            idx, plane->plane_id, plane->crtc_id);

                    for (QKmsPlane &kmsplane : m_planes) {
                        if (kmsplane.id == output.forced_plane_id) {
                            assignPlane(&output, &kmsplane);
                            break;
                        }
                    }

                    drmModeFreePlane(plane);
                }
            } else {
                qWarning("Invalid plane index %d, must be between 0 and %u", idx, planeResources->count_planes - 1);
            }
        }
    }

    // A more useful version: allows specifying "crtc_id,plane_id:crtc_id,plane_id:..."
    // in order to allow overriding the plane used for a given crtc.
    if (qEnvironmentVariableIsSet("QT_QPA_EGLFS_KMS_PLANES_FOR_CRTCS")) {
        const QString val = qEnvironmentVariable("QT_QPA_EGLFS_KMS_PLANES_FOR_CRTCS");
        qCDebug(qLcKmsDebug, "crtc_id:plane_id override list: %s", qPrintable(val));
        const QStringList crtcPlanePairs = val.split(u':');
        for (const QString &crtcPlanePair : crtcPlanePairs) {
            const QStringList values = crtcPlanePair.split(u',');
            if (values.size() == 2 && uint(values[0].toInt()) == output.crtc_id) {
                uint planeId = values[1].toInt();
                for (QKmsPlane &kmsplane : m_planes) {
                    if (kmsplane.id == planeId) {
                        assignPlane(&output, &kmsplane);
                        break;
                    }
                }
            }
        }
    }

    if (output.eglfs_plane) {
        qCDebug(qLcKmsDebug, "Chose plane %u for output %s (crtc id %u) (may not be applicable)",
                output.eglfs_plane->id, connectorName.constData(), output.crtc_id);
    }

#if QT_CONFIG(drm_atomic)
    if (hasAtomicSupport() && !output.eglfs_plane) {
        qCDebug(qLcKmsDebug, "No plane associated with output %s (crtc id %u) and atomic modesetting is enabled. This is bad.",
                connectorName.constData(), output.crtc_id);
    }
#endif

    m_crtc_allocator |= (1 << output.crtc_index);

    vinfo->output = output;

    return createScreen(output);
}